

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uchar * lodepng_chunk_next(uchar *chunk,uchar *end)

{
  uint uVar1;
  int iVar2;
  uchar *result;
  size_t total_chunk_length;
  uchar *end_local;
  uchar *chunk_local;
  
  chunk_local = end;
  if ((chunk < end) && (0xb < (long)end - (long)chunk)) {
    if ((((*chunk == 0x89) && (((chunk[1] == 'P' && (chunk[2] == 'N')) && (chunk[3] == 'G')))) &&
        (((chunk[4] == '\r' && (chunk[5] == '\n')) && (chunk[6] == '\x1a')))) && (chunk[7] == '\n'))
    {
      chunk_local = chunk + 8;
    }
    else {
      total_chunk_length = (size_t)end;
      end_local = chunk;
      uVar1 = lodepng_chunk_length(chunk);
      iVar2 = lodepng_addofl((ulong)uVar1,0xc,(size_t *)&result);
      if (iVar2 == 0) {
        chunk_local = end_local + (long)result;
        if (chunk_local < end_local) {
          chunk_local = (uchar *)total_chunk_length;
        }
      }
      else {
        chunk_local = (uchar *)total_chunk_length;
      }
    }
  }
  return chunk_local;
}

Assistant:

unsigned char* lodepng_chunk_next(unsigned char* chunk, unsigned char* end) {
  if(chunk >= end || end - chunk < 12) return end; /*too small to contain a chunk*/
  if(chunk[0] == 0x89 && chunk[1] == 0x50 && chunk[2] == 0x4e && chunk[3] == 0x47
    && chunk[4] == 0x0d && chunk[5] == 0x0a && chunk[6] == 0x1a && chunk[7] == 0x0a) {
    /* Is PNG magic header at start of PNG file. Jump to first actual chunk. */
    return chunk + 8;
  } else {
    size_t total_chunk_length;
    unsigned char* result;
    if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return end;
    result = chunk + total_chunk_length;
    if(result < chunk) return end; /*pointer overflow*/
    return result;
  }
}